

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O0

void __thiscall Logger::LogError(Logger *this,string *stringForLogError)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *stringForLogError_local;
  Logger *this_local;
  
  local_18 = stringForLogError;
  stringForLogError_local = &this->loggerPath;
  std::operator+(&local_38,&this->loggerPath,"/errors");
  std::ofstream::open((string *)&this->loggerFile,(_Ios_Openmode)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar1 = std::operator<<((ostream *)&this->loggerFile,"--ERROR--");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)stringForLogError);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  return;
}

Assistant:

void LogError(string stringForLogError) {
        loggerFile.open(this->loggerPath + "/errors", ios_base::app);
        loggerFile << "--ERROR--" << " " << stringForLogError << endl;
        loggerFile.close();
    }